

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O2

int __thiscall
ON_LineCurve::GetNurbForm
          (ON_LineCurve *this,ON_NurbsCurve *c,double tolerance,ON_Interval *subdomain)

{
  double *pdVar1;
  bool bVar2;
  ON_3dPoint *point;
  uint uVar3;
  ON_Interval *sd;
  double t;
  double t_00;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ON_3dPoint local_40;
  
  bVar2 = ON_NurbsCurve::Create(c,this->m_dim == 2 ^ 3,false,2,2);
  if (!bVar2) {
    return 0;
  }
  t = ON_Interval::operator[](&this->m_t,0);
  uVar3 = 1;
  t_00 = ON_Interval::operator[](&this->m_t,1);
  if (subdomain != (ON_Interval *)0x0) {
    if (t_00 <= t) {
      uVar3 = 0;
    }
    else {
      dVar4 = ON_Interval::operator[](subdomain,0);
      dVar5 = ON_Interval::operator[](subdomain,1);
      dVar6 = t;
      if (t <= dVar4) {
        dVar6 = dVar4;
      }
      dVar4 = t_00;
      if (dVar5 <= t_00) {
        dVar4 = dVar5;
      }
      dVar5 = dVar6;
      dVar7 = dVar4;
      if (dVar4 <= dVar6) {
        dVar5 = t;
        dVar7 = t_00;
      }
      uVar3 = (uint)(dVar6 < dVar4);
      t = dVar5;
      t_00 = dVar7;
    }
  }
  if (t_00 <= t) {
    pdVar1 = c->m_knot;
    if (t <= t_00) {
      *pdVar1 = 0.0;
      pdVar1[1] = 1.0;
      uVar3 = 0;
      ON_NurbsCurve::SetCV(c,0,&(this->m_line).from);
      point = &(this->m_line).to;
      goto LAB_004e559c;
    }
    *pdVar1 = t_00;
    pdVar1[1] = t;
    ON_Curve::PointAt(&local_40,&this->super_ON_Curve,t_00);
    uVar3 = 0;
    ON_NurbsCurve::SetCV(c,0,&local_40);
  }
  else {
    pdVar1 = c->m_knot;
    *pdVar1 = t;
    pdVar1[1] = t_00;
    ON_Curve::PointAt(&local_40,&this->super_ON_Curve,t);
    ON_NurbsCurve::SetCV(c,0,&local_40);
    t = t_00;
  }
  point = &local_40;
  ON_Curve::PointAt(&local_40,&this->super_ON_Curve,t);
LAB_004e559c:
  ON_NurbsCurve::SetCV(c,1,point);
  return uVar3;
}

Assistant:

int ON_LineCurve::GetNurbForm(
      ON_NurbsCurve& c,
      double tolerance,
      const ON_Interval* subdomain
      ) const
{
  int rc = 0;
  if ( c.Create( m_dim==2?2:3, false, 2, 2 ) ) 
  {
    rc = 1;
    double t0 = m_t[0];
    double t1 = m_t[1];
    if (subdomain )
    {
      if ( t0 < t1 )
      {
        const ON_Interval& sd = *subdomain;
        double s0 = sd[0];
        double s1 = sd[1];
        if (s0 < t0) s0 = t0;
        if (s1 > t1) s1 = t1;
        if (s0 < s1)
        {
          t0 = s0;
          t1 = s1;
        }
        else
          rc = 0;
      }
      else
      {
        rc = 0;
      }
    }  
    if ( t0 < t1 )
    {
      c.m_knot[0] = t0;
      c.m_knot[1] = t1;
      c.SetCV( 0, PointAt(t0));
      c.SetCV( 1, PointAt(t1));
    }
    else if ( t0 > t1 )
    {
      rc = 0;
      c.m_knot[0] = t1;
      c.m_knot[1] = t0;
      c.SetCV( 0, PointAt(t1));
      c.SetCV( 1, PointAt(t0));
    }
    else
    {
      rc = 0;
      c.m_knot[0] = 0.0;
      c.m_knot[1] = 1.0;
      c.SetCV( 0, m_line.from );
      c.SetCV( 1, m_line.to );
    }
  }
  return rc;
}